

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AggregationValidator.h
# Opt level: O0

void __thiscall
jaegertracing::thrift::AggregationValidatorConcurrentClient::~AggregationValidatorConcurrentClient
          (AggregationValidatorConcurrentClient *this,void **vtt)

{
  void **vtt_local;
  AggregationValidatorConcurrentClient *this_local;
  
  *(void **)this = *vtt;
  *(void **)(&this->field_0x0 + *(long *)(*(long *)this + -0x28)) = vtt[1];
  apache::thrift::async::TConcurrentClientSyncInfo::~TConcurrentClientSyncInfo(&this->sync_);
  std::shared_ptr<apache::thrift::protocol::TProtocol>::~shared_ptr(&this->poprot_);
  std::shared_ptr<apache::thrift::protocol::TProtocol>::~shared_ptr(&this->piprot_);
  return;
}

Assistant:

AggregationValidatorConcurrentClient(apache::thrift::stdcxx::shared_ptr< ::apache::thrift::protocol::TProtocol> prot) {
    setProtocol(prot);
  }